

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

pair<unsigned_long,_unsigned_long> __thiscall
google::
dense_hashtable<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>
::find_position<unsigned_long>
          (dense_hashtable<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>
           *this,unsigned_long *key)

{
  bool bVar1;
  size_type sVar2;
  pair<const_unsigned_long,_int> *in_RSI;
  dense_hashtable<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>
  *in_RDI;
  size_type insert_pos;
  size_type bucknum;
  size_type bucket_count_minus_one;
  size_type num_probes;
  unsigned_long *in_stack_ffffffffffffffa8;
  pair<const_unsigned_long,_int> *a;
  unsigned_long in_stack_ffffffffffffffb8;
  dense_hashtable<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>
  *this_00;
  dense_hashtable<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>
  *local_38;
  ulong local_30;
  long local_28;
  pair<const_unsigned_long,_int> *local_20;
  pair<unsigned_long,_unsigned_long> local_10;
  
  local_28 = 0;
  local_20 = in_RSI;
  sVar2 = bucket_count(in_RDI);
  local_30 = sVar2 - 1;
  sVar2 = hash<unsigned_long>(in_RDI,in_stack_ffffffffffffffa8);
  local_38 = (dense_hashtable<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>
              *)(sVar2 & local_30);
  this_00 = (dense_hashtable<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>
             *)0xffffffffffffffff;
  do {
    bVar1 = test_empty(this_00,in_stack_ffffffffffffffb8);
    if (bVar1) {
      if (this_00 ==
          (dense_hashtable<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>
           *)0xffffffffffffffff) {
        std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_true>
                  (&local_10,
                   &dense_hashtable<std::pair<unsigned_long_const,int>,unsigned_long,std::hash<unsigned_long>,google::dense_hash_map<unsigned_long,int,std::hash<unsigned_long>,std::equal_to<unsigned_long>,google::libc_allocator_with_realloc<std::pair<unsigned_long_const,int>>>::SelectKey,google::dense_hash_map<unsigned_long,int,std::hash<unsigned_long>,std::equal_to<unsigned_long>,google::libc_allocator_with_realloc<std::pair<unsigned_long_const,int>>>::SetKey,std::equal_to<unsigned_long>,google::libc_allocator_with_realloc<std::pair<unsigned_long_const,int>>>
                    ::ILLEGAL_BUCKET,(unsigned_long *)&local_38);
      }
      else {
        std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_true>
                  (&local_10,
                   &dense_hashtable<std::pair<unsigned_long_const,int>,unsigned_long,std::hash<unsigned_long>,google::dense_hash_map<unsigned_long,int,std::hash<unsigned_long>,std::equal_to<unsigned_long>,google::libc_allocator_with_realloc<std::pair<unsigned_long_const,int>>>::SelectKey,google::dense_hash_map<unsigned_long,int,std::hash<unsigned_long>,std::equal_to<unsigned_long>,google::libc_allocator_with_realloc<std::pair<unsigned_long_const,int>>>::SetKey,std::equal_to<unsigned_long>,google::libc_allocator_with_realloc<std::pair<unsigned_long_const,int>>>
                    ::ILLEGAL_BUCKET,(unsigned_long *)&stack0xffffffffffffffc0);
      }
      return local_10;
    }
    bVar1 = test_deleted(this_00,in_stack_ffffffffffffffb8);
    if (bVar1) {
      if (this_00 ==
          (dense_hashtable<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>
           *)0xffffffffffffffff) {
        this_00 = local_38;
      }
    }
    else {
      a = local_20;
      in_stack_ffffffffffffffb8 =
           dense_hashtable<std::pair<unsigned_long_const,int>,unsigned_long,std::hash<unsigned_long>,google::dense_hash_map<unsigned_long,int,std::hash<unsigned_long>,std::equal_to<unsigned_long>,google::libc_allocator_with_realloc<std::pair<unsigned_long_const,int>>>::SelectKey,google::dense_hash_map<unsigned_long,int,std::hash<unsigned_long>,std::equal_to<unsigned_long>,google::libc_allocator_with_realloc<std::pair<unsigned_long_const,int>>>::SetKey,std::equal_to<unsigned_long>,google::libc_allocator_with_realloc<std::pair<unsigned_long_const,int>>>
           ::get_key<std::pair<unsigned_long_const,int>&>(in_RDI,local_20);
      bVar1 = dense_hashtable<std::pair<unsigned_long_const,int>,unsigned_long,std::hash<unsigned_long>,google::dense_hash_map<unsigned_long,int,std::hash<unsigned_long>,std::equal_to<unsigned_long>,google::libc_allocator_with_realloc<std::pair<unsigned_long_const,int>>>::SelectKey,google::dense_hash_map<unsigned_long,int,std::hash<unsigned_long>,std::equal_to<unsigned_long>,google::libc_allocator_with_realloc<std::pair<unsigned_long_const,int>>>::SetKey,std::equal_to<unsigned_long>,google::libc_allocator_with_realloc<std::pair<unsigned_long_const,int>>>
              ::equals<unsigned_long,unsigned_long>(in_RDI,&a->first,(unsigned_long *)0x1047468);
      if (bVar1) {
        std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_true>
                  (&local_10,(unsigned_long *)&local_38,
                   &dense_hashtable<std::pair<unsigned_long_const,int>,unsigned_long,std::hash<unsigned_long>,google::dense_hash_map<unsigned_long,int,std::hash<unsigned_long>,std::equal_to<unsigned_long>,google::libc_allocator_with_realloc<std::pair<unsigned_long_const,int>>>::SelectKey,google::dense_hash_map<unsigned_long,int,std::hash<unsigned_long>,std::equal_to<unsigned_long>,google::libc_allocator_with_realloc<std::pair<unsigned_long_const,int>>>::SetKey,std::equal_to<unsigned_long>,google::libc_allocator_with_realloc<std::pair<unsigned_long_const,int>>>
                    ::ILLEGAL_BUCKET);
        return local_10;
      }
    }
    local_28 = local_28 + 1;
    local_38 = (dense_hashtable<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>
                *)((long)&(local_38->settings).
                          super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>
                          .enlarge_threshold_ + local_28 & local_30);
  } while( true );
}

Assistant:

std::pair<size_type, size_type> find_position(const K& key) const {
    size_type num_probes = 0;  // how many times we've probed
    const size_type bucket_count_minus_one = bucket_count() - 1;
    size_type bucknum = hash(key) & bucket_count_minus_one;
    size_type insert_pos = ILLEGAL_BUCKET;  // where we would insert
    while (1) {                             // probe until something happens
      if (test_empty(bucknum)) {            // bucket is empty
        if (insert_pos == ILLEGAL_BUCKET)   // found no prior place to insert
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, bucknum);
        else
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, insert_pos);

      } else if (test_deleted(bucknum)) {  // keep searching, but mark to insert
        if (insert_pos == ILLEGAL_BUCKET) insert_pos = bucknum;

      } else if (equals(key, get_key(table[bucknum]))) {
        return std::pair<size_type, size_type>(bucknum, ILLEGAL_BUCKET);
      }
      ++num_probes;  // we're doing another probe
      bucknum = (bucknum + JUMP_(key, num_probes)) & bucket_count_minus_one;
      assert(num_probes < bucket_count() &&
             "Hashtable is full: an error in key_equal<> or hash<>");
    }
  }